

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMDLoad(TranslateToFuzzReader *this)

{
  Random *this_00;
  __uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true> _Var1;
  double dVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  int8_t iVar5;
  SIMDLoadOp SVar6;
  int iVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  long lVar10;
  
  this_00 = &this->random;
  lVar10 = 0;
  SVar6 = Random::
          pick<wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp,wasm::SIMDLoadOp>
                    (this_00,Load8SplatVec128,Load16SplatVec128,Load32SplatVec128,Load64SplatVec128,
                     Load8x8SVec128,Load8x8UVec128,Load16x4SVec128,Load16x4UVec128,Load32x2SVec128,
                     Load32x2UVec128,Load32ZeroVec128,Load64ZeroVec128);
  iVar5 = Random::get(this_00);
  dVar2 = log((double)(iVar5 + 1 + (uint)(iVar5 == -1)));
  switch(SVar6) {
  case Load8SplatVec128:
    lVar10 = 1;
    break;
  case Load16SplatVec128:
    iVar7 = Random::pick<int,int>(this_00,1,2);
    goto LAB_0014f4a5;
  case Load32SplatVec128:
    iVar7 = Random::pick<int,int,int>(this_00,1,2,4);
    goto LAB_0014f4a5;
  case Load64SplatVec128:
  case Load8x8SVec128:
  case Load8x8UVec128:
  case Load16x4SVec128:
  case Load16x4UVec128:
  case Load32x2SVec128:
  case Load32x2UVec128:
    iVar7 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
LAB_0014f4a5:
    lVar10 = (long)iVar7;
    break;
  case Load32ZeroVec128:
    lVar10 = 4;
    break;
  case Load64ZeroVec128:
    lVar10 = 8;
  }
  dVar2 = floor(dVar2);
  pEVar8 = makePointer(this);
  _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (((this->wasm->memories).
         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>;
  uVar3 = *(undefined8 *)
           _Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  uVar4 = *(uintptr_t *)
           ((long)_Var1.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
                  .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
  pEVar9 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x40,8);
  pEVar9->_id = SIMDLoadId;
  (pEVar9->type).id = 0;
  pEVar9[1].type.id = 0;
  *(undefined8 *)(pEVar9 + 2) = 0;
  *(SIMDLoadOp *)(pEVar9 + 1) = SVar6;
  pEVar9[1].type.id = (long)dVar2 & 0xffffffff;
  *(long *)(pEVar9 + 2) = lVar10;
  pEVar9[2].type.id = (uintptr_t)pEVar8;
  *(undefined8 *)(pEVar9 + 3) = uVar3;
  pEVar9[3].type.id = uVar4;
  ::wasm::SIMDLoad::finalize();
  return pEVar9;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMDLoad() {
  SIMDLoadOp op = pick(Load8SplatVec128,
                       Load16SplatVec128,
                       Load32SplatVec128,
                       Load64SplatVec128,
                       Load8x8SVec128,
                       Load8x8UVec128,
                       Load16x4SVec128,
                       Load16x4UVec128,
                       Load32x2SVec128,
                       Load32x2UVec128,
                       Load32ZeroVec128,
                       Load64ZeroVec128);
  Address offset = logify(get());
  Address align;
  switch (op) {
    case Load8SplatVec128:
      align = 1;
      break;
    case Load16SplatVec128:
      align = pick(1, 2);
      break;
    case Load32SplatVec128:
      align = pick(1, 2, 4);
      break;
    case Load64SplatVec128:
    case Load8x8SVec128:
    case Load8x8UVec128:
    case Load16x4SVec128:
    case Load16x4UVec128:
    case Load32x2SVec128:
    case Load32x2UVec128:
      align = pick(1, 2, 4, 8);
      break;
    case Load32ZeroVec128:
      align = 4;
      break;
    case Load64ZeroVec128:
      align = 8;
      break;
  }
  Expression* ptr = makePointer();
  return builder.makeSIMDLoad(op, offset, align, ptr, wasm.memories[0]->name);
}